

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Ppmd7_Construct(CPpmd7 *p)

{
  uint uVar1;
  long in_RDI;
  uint step;
  uint m;
  uint k;
  uint i;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  *(undefined8 *)(in_RDI + 0x40) = 0;
  local_10 = 0;
  for (local_c = 0; local_c < 0x26; local_c = local_c + 1) {
    if (local_c < 0xc) {
      local_1c = (local_c >> 2) + 1;
    }
    else {
      local_1c = 4;
    }
    local_18 = local_1c;
    do {
      uVar1 = local_10 + 1;
      *(char *)(in_RDI + 0x92 + (ulong)local_10) = (char)local_c;
      local_18 = local_18 + -1;
      local_10 = uVar1;
    } while (local_18 != 0);
    *(char *)(in_RDI + 0x6c + (ulong)local_c) = (char)uVar1;
  }
  *(undefined1 *)(in_RDI + 0x2ac) = 0;
  *(undefined1 *)(in_RDI + 0x2ad) = 2;
  memset((void *)(in_RDI + 0x2ae),4,9);
  memset((void *)(in_RDI + 0x2b7),6,0xf5);
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    *(char *)(in_RDI + 0x1ac + (ulong)local_c) = (char)local_c;
  }
  local_14 = local_c;
  local_10 = 1;
  for (; local_c < 0x100; local_c = local_c + 1) {
    *(char *)(in_RDI + 0x1ac + (ulong)local_c) = (char)local_14;
    local_10 = local_10 + -1;
    if (local_10 == 0) {
      local_10 = local_14 - 1;
      local_14 = local_14 + 1;
    }
  }
  memset((void *)(in_RDI + 0x3ac),0,0x40);
  memset((void *)(in_RDI + 0x3ec),8,0xc0);
  return;
}

Assistant:

static void Ppmd7_Construct(CPpmd7 *p)
{
  unsigned i, k, m;

  p->Base = 0;

  for (i = 0, k = 0; i < PPMD_NUM_INDEXES; i++)
  {
    unsigned step = (i >= 12 ? 4 : (i >> 2) + 1);
    do { p->Units2Indx[k++] = (Byte)i; } while(--step);
    p->Indx2Units[i] = (Byte)k;
  }

  p->NS2BSIndx[0] = (0 << 1);
  p->NS2BSIndx[1] = (1 << 1);
  memset(p->NS2BSIndx + 2, (2 << 1), 9);
  memset(p->NS2BSIndx + 11, (3 << 1), 256 - 11);

  for (i = 0; i < 3; i++)
    p->NS2Indx[i] = (Byte)i;
  for (m = i, k = 1; i < 256; i++)
  {
    p->NS2Indx[i] = (Byte)m;
    if (--k == 0)
      k = (++m) - 2;
  }

  memset(p->HB2Flag, 0, 0x40);
  memset(p->HB2Flag + 0x40, 8, 0x100 - 0x40);
}